

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_UnwantedValue_Test::~ClCommandLine_UnwantedValue_Test
          (ClCommandLine_UnwantedValue_Test *this)

{
  ClCommandLine_UnwantedValue_Test *this_local;
  
  ~ClCommandLine_UnwantedValue_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, UnwantedValue) {
    opt<bool> opt{"opt"};

    this->add ("progname", "--opt=true");

    string_stream output;
    string_stream errors;
    EXPECT_FALSE (this->parse_command_line_options (output, errors));
    EXPECT_THAT (errors.str (),
                 ::testing::HasSubstr (PSTORE_NATIVE_TEXT ("does not take a value")));
    EXPECT_EQ (output.str ().length (), 0U);
    EXPECT_FALSE (opt.get ());
}